

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O3

void fft2d(float *data,long M2,long M)

{
  ulong iRsiz;
  ulong uVar1;
  long Rows;
  
  if (M < 1 || M2 < 1) {
    ffts(data,M + M2,1);
    return;
  }
  Rows = 1L << (M2 & 0x3fU);
  ffts(data,M,Rows);
  iRsiz = 1L << (M & 0x3fU);
  if (2 < (ulong)M) {
    uVar1 = 0;
    do {
      dxpose((xdouble *)data,iRsiz,(xdouble *)Array2d[M2],Rows,Rows,4);
      ffts(Array2d[M2],M2,4);
      dxpose((xdouble *)Array2d[M2],Rows,(xdouble *)data,iRsiz,4,Rows);
      uVar1 = uVar1 + 4;
      data = (float *)((long)data + 0x20);
    } while (uVar1 < iRsiz);
    return;
  }
  dxpose((xdouble *)data,iRsiz,(xdouble *)Array2d[M2],Rows,Rows,iRsiz);
  ffts(Array2d[M2],M2,iRsiz);
  dxpose((xdouble *)Array2d[M2],Rows,(xdouble *)data,iRsiz,iRsiz,Rows);
  return;
}

Assistant:

void fft2d(float *data, long M2, long M){
/* Compute 2D complex fft and return results in-place	*/
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows */
/* M = log2 of fft size number of columns */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	ffts(data, M, POW2(M2));
	if (M>2)
		for (i1=0; i1<POW2(M); i1+=4){
			cxpose(data + i1*2, POW2(M), Array2d[M2], POW2(M2), POW2(M2), 4);
			ffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M), 4, POW2(M2));
		}
	else{
		cxpose(data, POW2(M), Array2d[M2], POW2(M2), POW2(M2), POW2(M));
		ffts(Array2d[M2], M2, POW2(M));
		cxpose(Array2d[M2], POW2(M2), data, POW2(M), POW2(M), POW2(M2));
	}
}
else
	ffts(data, M2+M, 1);
}